

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O1

bool __thiscall DynamicGraph::checkComponentBreak(DynamicGraph *this,Vertex *v,Vertex *u)

{
  ulong uVar1;
  pointer puVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  allocator_type *paVar5;
  bool bVar6;
  _List_node_base *p_Var7;
  allocator_type *paVar8;
  ulong uVar9;
  AdjList *g;
  vector<bool,_std::allocator<bool>_> visitedU;
  list<unsigned_long,_std::allocator<unsigned_long>_> visitedListV;
  vector<bool,_std::allocator<bool>_> visitedV;
  list<unsigned_long,_std::allocator<unsigned_long>_> visitedListU;
  list<unsigned_long,_std::allocator<unsigned_long>_> queueU;
  list<unsigned_long,_std::allocator<unsigned_long>_> queueV;
  vector<bool,_std::allocator<bool>_> local_e0;
  _List_node_base local_b8;
  long local_a8;
  vector<bool,_std::allocator<bool>_> local_a0;
  allocator_type *local_78;
  allocator_type *local_70;
  long local_68;
  _List_node_base local_60;
  long local_50;
  _List_node_base local_48;
  long local_38;
  
  local_48._M_next = &local_48;
  local_38 = 0;
  local_60._M_next = &local_60;
  local_50 = 0;
  local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  local_60._M_prev = local_60._M_next;
  local_48._M_prev = local_48._M_next;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_a0,
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_e0,
             (allocator_type *)&local_b8);
  local_b8._M_next = (_List_node_base *)((ulong)local_b8._M_next & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_e0,
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_b8,
             (allocator_type *)&local_78);
  local_a8 = 0;
  local_68 = 0;
  uVar1 = *v;
  uVar9 = uVar1 + 0x3f;
  if (-1 < (long)uVar1) {
    uVar9 = uVar1;
  }
  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p
  [((long)uVar9 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
       local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p
       [((long)uVar9 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
       1L << ((byte)uVar1 & 0x3f);
  uVar1 = *u;
  uVar9 = uVar1 + 0x3f;
  if (-1 < (long)uVar1) {
    uVar9 = uVar1;
  }
  local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p
  [((long)uVar9 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
       local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p
       [((long)uVar9 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
       1L << ((byte)uVar1 & 0x3f);
  local_b8._M_next = &local_b8;
  local_b8._M_prev = &local_b8;
  local_78 = (allocator_type *)&local_78;
  local_70 = (allocator_type *)&local_78;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)*v;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  local_38 = local_38 + 1;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)*u;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  local_50 = local_50 + 1;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)*v;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  local_a8 = local_a8 + 1;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)*u;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  local_68 = local_68 + 1;
  while( true ) {
    bVar4 = local_60._M_next == &local_60 || local_48._M_next == &local_48;
    paVar5 = local_78;
    if ((((bVar4) || (this->halt != false)) ||
        (bVar6 = bdbfsStep(this,(list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
                           &local_a0,&local_e0,
                           (list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8),
        paVar5 = local_78, !bVar6)) || (this->halt != false)) goto joined_r0x0010b807;
    if (local_48._M_next == &local_48) break;
    bVar6 = bdbfsStep(this,(list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
                      &local_e0,&local_a0,
                      (list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78);
    paVar5 = local_78;
    if ((!bVar6) || (this->halt != false)) goto joined_r0x0010b807;
    if (local_60._M_next == &local_60) {
      this->halt = true;
      this->nextComponent = this->nextComponent + 1;
      bVar4 = true;
      if (local_78 != (allocator_type *)&local_78) {
        puVar2 = (this->components).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar8 = local_78;
        do {
          puVar2[*(long *)(paVar8 + 0x10)] = this->nextComponent;
          paVar8 = *(allocator_type **)paVar8;
        } while (paVar8 != (allocator_type *)&local_78);
      }
joined_r0x0010b807:
      while (p_Var7 = local_b8._M_next, paVar5 != (allocator_type *)&local_78) {
        paVar8 = *(allocator_type **)paVar5;
        operator_delete(paVar5,0x18);
        paVar5 = paVar8;
      }
      while (p_Var7 != &local_b8) {
        p_Var3 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var7->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var7,0x18);
        p_Var7 = p_Var3;
      }
      if (local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      p_Var7 = local_60._M_next;
      if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        p_Var7 = local_60._M_next;
      }
      while (p_Var3 = local_48._M_next, p_Var7 != &local_60) {
        p_Var3 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var7->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var7,0x18);
        p_Var7 = p_Var3;
      }
      while (p_Var3 != &local_48) {
        p_Var7 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var3->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var3,0x18);
        p_Var3 = p_Var7;
      }
      return bVar4;
    }
  }
  this->halt = true;
  this->nextComponent = this->nextComponent + 1;
  bVar4 = true;
  if (local_b8._M_next != &local_b8) {
    puVar2 = (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    p_Var7 = local_b8._M_next;
    do {
      puVar2[(long)p_Var7[1]._M_next] = this->nextComponent;
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != &local_b8);
  }
  goto joined_r0x0010b807;
}

Assistant:

bool DynamicGraph::checkComponentBreak(const Vertex &v, const Vertex &u)
{
    std::list<Vertex> queueV;
    std::list<Vertex> queueU;
    std::vector<bool> visitedV(boost::num_vertices(*this), false);
    std::vector<bool> visitedU(boost::num_vertices(*this), false);
    std::list<Vertex> visitedListV;
    std::list<Vertex> visitedListU;

    // Using bidirectional BFS
    visitedV[v]=true;
    visitedU[u]=true;
    queueV.push_back(v);
    queueU.push_back(u);
    visitedListV.push_back(v);
    visitedListU.push_back(u);
    while(!queueV.empty() && !queueU.empty()) {
        if (this->halt) {
            return false;
        }

        if(!this->bdbfsStep(queueV, visitedV, visitedU, visitedListV)
           || this->halt) {
            return false;
        }

        if (queueV.empty()) {
            this->halt = true;
            updateVisitedComponents(visitedListV);
            break;
        }

        if(!this->bdbfsStep(queueU, visitedU, visitedV, visitedListU)
           || this->halt) {
            return false;
        }

        if (queueU.empty()) {
            this->halt = true;
            updateVisitedComponents(visitedListU);
            break;
        }
    }
    return true;
}